

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

int clip_uhd_num_image_embeds_col(clip_ctx *ctx_clip)

{
  slice_instructions inst;
  clip_image_size *in_stack_000000e0;
  clip_ctx *in_stack_000000e8;
  undefined4 local_30;
  
  llava_uhd::get_slice_instructions(in_stack_000000e8,in_stack_000000e0);
  llava_uhd::slice_instructions::~slice_instructions((slice_instructions *)0x196496);
  return local_30;
}

Assistant:

int clip_uhd_num_image_embeds_col(struct clip_ctx * ctx_clip) {
    const auto inst = llava_uhd::get_slice_instructions(ctx_clip, ctx_clip->load_image_size);
    return inst.grid_size.width;
}